

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

void decSetSubnormal(decNumber *dn,decContext *set,int32_t *residue,uint32_t *status)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int32_t iVar6;
  int32_t adjust;
  int32_t etiny;
  decContext workset;
  uint32_t *status_local;
  int32_t *residue_local;
  decContext *set_local;
  decNumber *dn_local;
  
  iVar4 = set->emin - (set->digits + -1);
  if (((dn->lsu[0] == '\0') && (dn->digits == 1)) && ((dn->bits & 0x70) == 0)) {
    if (dn->exponent < iVar4) {
      dn->exponent = iVar4;
      *status = *status | 0x400;
    }
  }
  else {
    *status = *status | 0x1000;
    iVar5 = iVar4 - dn->exponent;
    if (iVar5 < 1) {
      if ((*status & 0x20) != 0) {
        *status = *status | 0x2000;
      }
    }
    else {
      uVar2 = set->emax;
      uVar1 = set->emin;
      uVar3 = set->round;
      workset.emin = set->traps;
      workset.round = set->status;
      workset.traps = *(uint32_t *)&set->clamp;
      etiny = uVar2;
      adjust = dn->digits - iVar5;
      workset.emax = uVar3;
      workset.digits = uVar1 - iVar5;
      workset._20_8_ = status;
      decSetCoeff(dn,(decContext *)&adjust,dn->lsu,dn->digits,residue,status);
      decApplyRound(dn,(decContext *)&adjust,*residue,(uint32_t *)workset._20_8_);
      if ((*(uint *)workset._20_8_ & 0x20) != 0) {
        *(uint *)workset._20_8_ = *(uint *)workset._20_8_ | 0x2000;
      }
      if (iVar4 < dn->exponent) {
        iVar6 = decShiftToMost(dn->lsu,dn->digits,1);
        dn->digits = iVar6;
        dn->exponent = dn->exponent + -1;
      }
      if (((dn->lsu[0] == '\0') && (dn->digits == 1)) && ((dn->bits & 0x70) == 0)) {
        *(uint *)workset._20_8_ = *(uint *)workset._20_8_ | 0x400;
      }
    }
  }
  return;
}

Assistant:

static void decSetSubnormal(decNumber *dn, decContext *set, Int *residue,
                            uInt *status) {
  decContext workset;         /* work  */
  Int        etiny, adjust;   /* ..  */

  #if DECSUBSET
  /* simple set to zero and 'hard underflow' for subset  */
  if (!set->extended) {
    uprv_decNumberZero(dn);
    /* always full overflow  */
    *status|=DEC_Underflow | DEC_Subnormal | DEC_Inexact | DEC_Rounded;
    return;
    }
  #endif

  /* Full arithmetic -- allow subnormals, rounded to minimum exponent  */
  /* (Etiny) if needed  */
  etiny=set->emin-(set->digits-1);      /* smallest allowed exponent  */

  if ISZERO(dn) {                       /* value is zero  */
    /* residue can never be non-zero here  */
    #if DECCHECK
      if (*residue!=0) {
        printf("++ Subnormal 0 residue %ld\n", (LI)*residue);
        *status|=DEC_Invalid_operation;
        }
    #endif
    if (dn->exponent<etiny) {           /* clamp required  */
      dn->exponent=etiny;
      *status|=DEC_Clamped;
      }
    return;
    }

  *status|=DEC_Subnormal;               /* have a non-zero subnormal  */
  adjust=etiny-dn->exponent;            /* calculate digits to remove  */
  if (adjust<=0) {                      /* not out of range; unrounded  */
    /* residue can never be non-zero here, except in the Nmin-residue  */
    /* case (which is a subnormal result), so can take fast-path here  */
    /* it may already be inexact (from setting the coefficient)  */
    if (*status&DEC_Inexact) *status|=DEC_Underflow;
    return;
    }

  /* adjust>0, so need to rescale the result so exponent becomes Etiny  */
  /* [this code is similar to that in rescale]  */
  workset=*set;                         /* clone rounding, etc.  */
  workset.digits=dn->digits-adjust;     /* set requested length  */
  workset.emin-=adjust;                 /* and adjust emin to match  */
  /* [note that the latter can be <1, here, similar to Rescale case]  */
  decSetCoeff(dn, &workset, dn->lsu, dn->digits, residue, status);
  decApplyRound(dn, &workset, *residue, status);

  /* Use 754 default rule: Underflow is set iff Inexact  */
  /* [independent of whether trapped]  */
  if (*status&DEC_Inexact) *status|=DEC_Underflow;

  /* if rounded up a 999s case, exponent will be off by one; adjust  */
  /* back if so [it will fit, because it was shortened earlier]  */
  if (dn->exponent>etiny) {
    dn->digits=decShiftToMost(dn->lsu, dn->digits, 1);
    dn->exponent--;                     /* (re)adjust the exponent.  */
    }

  /* if rounded to zero, it is by definition clamped...  */
  if (ISZERO(dn)) *status|=DEC_Clamped;
  }